

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractsocket.cpp
# Opt level: O1

bool __thiscall QAbstractSocketPrivate::canReadNotification(QAbstractSocketPrivate *this)

{
  SocketType SVar1;
  long *plVar2;
  char cVar3;
  bool bVar4;
  byte bVar5;
  ulong uVar6;
  ulong uVar7;
  
  if (this->isBuffered == true) {
    if (*(long *)&this->field_0x90 == 0) {
      uVar7 = 0;
    }
    else {
      uVar7 = *(ulong *)(*(long *)&this->field_0x90 + 0x18);
    }
    plVar2 = *(long **)&this->field_0x8;
    if ((this->readBufferMaxSize == 0) || ((long)uVar7 < this->readBufferMaxSize)) {
      bVar4 = readFromSocket(this);
      if (!bVar4) {
        (**(code **)(*plVar2 + 0x100))(plVar2);
        goto LAB_001c08c3;
      }
      if (*(long *)&this->field_0x90 == 0) {
        uVar6 = 0;
      }
      else {
        uVar6 = *(ulong *)(*(long *)&this->field_0x90 + 0x18);
      }
      if (uVar6 == uVar7) {
        bVar5 = QIODevice::isReadable();
        uVar6 = (ulong)(bVar5 ^ 1);
        bVar4 = false;
      }
      else {
        bVar4 = true;
      }
    }
    else {
      (**(code **)(*(long *)this->socketEngine + 0x140))();
LAB_001c08c3:
      bVar4 = false;
      uVar6 = 0;
    }
    bVar5 = (byte)uVar6;
    if (!bVar4) goto LAB_001c08d6;
LAB_001c08ca:
    emitReadyRead(this,0);
  }
  else {
    SVar1 = this->socketType;
    if ((this->hasPendingData != true) ||
       ((SVar1 == UdpSocket && (this->hasPendingDatagram != true)))) {
      if (SVar1 == UdpSocket) {
        cVar3 = (**(code **)(*(long *)this->socketEngine + 0xe8))();
        if (cVar3 != '\0') goto LAB_001c0859;
      }
      else {
LAB_001c0859:
        this->hasPendingData = true;
        this->hasPendingDatagram = SVar1 == UdpSocket;
      }
      goto LAB_001c08ca;
    }
    (**(code **)(*(long *)this->socketEngine + 0x140))(this->socketEngine,0);
  }
  bVar5 = 1;
LAB_001c08d6:
  return (bool)(bVar5 & 1);
}

Assistant:

bool QAbstractSocketPrivate::canReadNotification()
{
    Q_Q(QAbstractSocket);
#if defined (QABSTRACTSOCKET_DEBUG)
    qDebug("QAbstractSocketPrivate::canReadNotification()");
#endif

    // If buffered, read data from the socket into the read buffer
    if (isBuffered) {
        const qint64 oldBufferSize = buffer.size();

        // Return if there is no space in the buffer
        if (readBufferMaxSize && oldBufferSize >= readBufferMaxSize) {
            socketEngine->setReadNotificationEnabled(false);
#if defined (QABSTRACTSOCKET_DEBUG)
            qDebug("QAbstractSocketPrivate::canReadNotification() buffer is full");
#endif
            return false;
        }

        // If reading from the socket fails after getting a read
        // notification, close the socket.
        if (!readFromSocket()) {
#if defined (QABSTRACTSOCKET_DEBUG)
            qDebug("QAbstractSocketPrivate::canReadNotification() disconnecting socket");
#endif
            q->disconnectFromHost();
            return false;
        }

        // Return if there is no new data available.
        if (buffer.size() == oldBufferSize) {
            // If the socket is opened only for writing, return true
            // to indicate that the data was discarded.
            return !q->isReadable();
        }
    } else {
        const bool isUdpSocket = (socketType == QAbstractSocket::UdpSocket);
        if (hasPendingData && (!isUdpSocket || hasPendingDatagram)) {
            socketEngine->setReadNotificationEnabled(false);
            return true;
        }
        if (!isUdpSocket
#if QT_CONFIG(udpsocket)
            || socketEngine->hasPendingDatagrams()
#endif
        ) {
            hasPendingData = true;
            hasPendingDatagram = isUdpSocket;
        }
    }

    emitReadyRead();

#if defined (QABSTRACTSOCKET_DEBUG)
    // If we were closed as a result of the readyRead() signal.
    if (state == QAbstractSocket::UnconnectedState || state == QAbstractSocket::ClosingState)
        qDebug("QAbstractSocketPrivate::canReadNotification() socket is closing - returning");
#endif

    return true;
}